

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,AffineSpace3fa *xfm0,AffineSpace3fa *xfm1,
          Ref<embree::SceneGraph::Node> *child)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Vector *pVVar4;
  size_t sVar5;
  Node *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar23;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  
  Node::Node(&this->super_Node,false);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__TransformNode_002a7538;
  uVar7 = *(undefined8 *)&(xfm0->l).vx.field_0;
  uVar8 = *(undefined8 *)((long)&(xfm0->l).vx.field_0 + 8);
  uVar9 = *(undefined8 *)&(xfm0->l).vy.field_0;
  uVar10 = *(undefined8 *)((long)&(xfm0->l).vy.field_0 + 8);
  uVar11 = *(undefined8 *)&(xfm0->l).vz.field_0;
  uVar12 = *(undefined8 *)((long)&(xfm0->l).vz.field_0 + 8);
  uVar13 = *(undefined8 *)&(xfm0->p).field_0;
  uVar14 = *(undefined8 *)((long)&(xfm0->p).field_0 + 8);
  uVar15 = *(undefined8 *)&(xfm1->l).vx.field_0;
  uVar16 = *(undefined8 *)((long)&(xfm1->l).vx.field_0 + 8);
  uVar17 = *(undefined8 *)&(xfm1->l).vy.field_0;
  uVar18 = *(undefined8 *)((long)&(xfm1->l).vy.field_0 + 8);
  uVar19 = *(undefined8 *)&(xfm1->l).vz.field_0;
  uVar20 = *(undefined8 *)((long)&(xfm1->l).vz.field_0 + 8);
  uVar21 = *(undefined8 *)&(xfm1->p).field_0;
  uVar22 = *(undefined8 *)((long)&(xfm1->p).field_0 + 8);
  (this->spaces).time_range.lower = 0.0;
  (this->spaces).time_range.upper = 1.0;
  (this->spaces).spaces.size_active = 0;
  (this->spaces).spaces.size_alloced = 0;
  *(undefined8 *)((long)&(this->spaces).spaces.size_alloced + 1) = 0;
  *(undefined8 *)((long)&(this->spaces).spaces.items + 1) = 0;
  pAVar23 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(0x40,0x10);
  (this->spaces).spaces.items = pAVar23;
  alignedFree((void *)0x0);
  (this->spaces).spaces.size_alloced = 1;
  pAVar23 = (this->spaces).spaces.items;
  (this->spaces).spaces.size_active = 1;
  *(undefined8 *)&(pAVar23->l).vx.field_0 = uVar7;
  *(undefined8 *)((long)&(pAVar23->l).vx.field_0 + 8) = uVar8;
  *(undefined8 *)&(pAVar23->l).vy.field_0 = uVar9;
  *(undefined8 *)((long)&(pAVar23->l).vy.field_0 + 8) = uVar10;
  *(undefined8 *)&(pAVar23->l).vz.field_0 = uVar11;
  *(undefined8 *)((long)&(pAVar23->l).vz.field_0 + 8) = uVar12;
  *(undefined8 *)&(pAVar23->p).field_0 = uVar13;
  *(undefined8 *)((long)&(pAVar23->p).field_0 + 8) = uVar14;
  sVar5 = (this->spaces).spaces.size_active;
  uVar26 = (this->spaces).spaces.size_alloced;
  uVar1 = sVar5 + 1;
  if (uVar26 < uVar1) {
    uVar27 = uVar26;
    uVar28 = uVar1;
    if (uVar26 != 0) {
      for (; uVar28 = uVar27, uVar27 < uVar1; uVar27 = uVar27 * 2 + (ulong)(uVar27 * 2 == 0)) {
      }
    }
    if (uVar26 != uVar28) {
      pAVar23 = (this->spaces).spaces.items;
      pAVar24 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                alignedMalloc(uVar28 << 6,0x10);
      (this->spaces).spaces.items = pAVar24;
      lVar25 = 0x30;
      for (uVar26 = 0; uVar26 < (this->spaces).spaces.size_active; uVar26 = uVar26 + 1) {
        pAVar24 = (this->spaces).spaces.items;
        puVar2 = (undefined8 *)((long)pAVar23 + lVar25 + -0x30);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)pAVar24 + lVar25 + -0x30);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        puVar2 = (undefined8 *)((long)pAVar23 + lVar25 + -0x20);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)pAVar24 + lVar25 + -0x20);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        puVar2 = (undefined8 *)((long)pAVar23 + lVar25 + -0x10);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)pAVar24 + lVar25 + -0x10);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        puVar2 = (undefined8 *)((long)&(pAVar23->l).vx.field_0 + lVar25);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)&(pAVar24->l).vx.field_0 + lVar25);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        lVar25 = lVar25 + 0x40;
      }
      alignedFree(pAVar23);
      (this->spaces).spaces.size_active = sVar5;
      (this->spaces).spaces.size_alloced = uVar28;
    }
  }
  pAVar23 = (this->spaces).spaces.items;
  (this->spaces).spaces.size_active = uVar1;
  *(undefined8 *)&pAVar23[sVar5].l.vx.field_0 = uVar15;
  *(undefined8 *)((long)&pAVar23[sVar5].l.vx.field_0 + 8) = uVar16;
  pVVar4 = &pAVar23[sVar5].l.vy;
  *(undefined8 *)&pVVar4->field_0 = uVar17;
  *(undefined8 *)((long)&pVVar4->field_0 + 8) = uVar18;
  pVVar4 = &pAVar23[sVar5].l.vz;
  *(undefined8 *)&pVVar4->field_0 = uVar19;
  *(undefined8 *)((long)&pVVar4->field_0 + 8) = uVar20;
  local_b8 = (float)uVar21;
  fStack_b4 = (float)((ulong)uVar21 >> 0x20);
  fStack_b0 = (float)uVar22;
  fStack_ac = (float)((ulong)uVar22 >> 0x20);
  pVVar4 = &pAVar23[sVar5].p;
  (pVVar4->field_0).m128[0] = local_b8;
  (pVVar4->field_0).m128[1] = fStack_b4;
  (pVVar4->field_0).m128[2] = fStack_b0;
  (pVVar4->field_0).m128[3] = fStack_ac;
  pNVar6 = child->ptr;
  (this->child).ptr = pNVar6;
  if (pNVar6 != (Node *)0x0) {
    (*(pNVar6->super_RefCount)._vptr_RefCount[2])();
  }
  return;
}

Assistant:

TransformNode (const AffineSpace3fa& xfm0, const AffineSpace3fa& xfm1, const Ref<Node>& child)
        : spaces((AffineSpace3ff)xfm0,(AffineSpace3ff)xfm1), child(child) {}